

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

void __thiscall evaluator::Evaluator::~Evaluator(Evaluator *this)

{
  if (NATIVE_TRUE.addr != (Object *)0x0) {
    (*(NATIVE_TRUE.addr)->_vptr_Object[2])();
  }
  if (NATIVE_FALSE.addr != (Object *)0x0) {
    (*(NATIVE_FALSE.addr)->_vptr_Object[2])();
  }
  if (NATIVE_NULL.addr != (Object *)0x0) {
    (*(NATIVE_NULL.addr)->_vptr_Object[2])();
    return;
  }
  return;
}

Assistant:

Evaluator::~Evaluator()
{
    delete NATIVE_TRUE;
    delete NATIVE_FALSE;
    delete NATIVE_NULL;
}